

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsimplifier.h
# Opt level: O3

void __thiscall
soplex::
SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxSimplifier(SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,char *p_name,TYPE ttype)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  Timer *pTVar2;
  
  this->_vptr_SPxSimplifier = (_func_int **)&PTR__SPxSimplifier_003b36f8;
  this->m_name = p_name;
  this->m_timeUsed = (Timer *)0x0;
  this->m_timerType = ttype;
  (this->m_objoffset).m_backend.fpclass = cpp_dec_float_finite;
  (this->m_objoffset).m_backend.prec_elem = 10;
  this->m_remRows = 0;
  this->m_remCols = 0;
  this->m_remNzos = 0;
  this->m_chgBnds = 0;
  this->m_chgLRhs = 0;
  this->m_keptBnds = 0;
  this->m_keptLRhs = 0;
  (this->m_objoffset).m_backend.data._M_elems[0] = 0;
  pcVar1 = &(this->m_objoffset).m_backend;
  (pcVar1->data)._M_elems[1] = 0;
  (pcVar1->data)._M_elems[2] = 0;
  pcVar1 = &(this->m_objoffset).m_backend;
  (pcVar1->data)._M_elems[3] = 0;
  (pcVar1->data)._M_elems[4] = 0;
  pcVar1 = &(this->m_objoffset).m_backend;
  (pcVar1->data)._M_elems[5] = 0;
  (pcVar1->data)._M_elems[6] = 0;
  pcVar1 = &(this->m_objoffset).m_backend;
  (pcVar1->data)._M_elems[7] = 0;
  (pcVar1->data)._M_elems[8] = 0;
  *(undefined8 *)((long)(this->m_objoffset).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(this->m_objoffset).m_backend.data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&this->m_objoffset,0.0);
  (this->m_minReduction).m_backend.fpclass = cpp_dec_float_finite;
  (this->m_minReduction).m_backend.prec_elem = 10;
  (this->m_minReduction).m_backend.data._M_elems[0] = 0;
  (this->m_minReduction).m_backend.data._M_elems[1] = 0;
  pcVar1 = &(this->m_minReduction).m_backend;
  (pcVar1->data)._M_elems[2] = 0;
  (pcVar1->data)._M_elems[3] = 0;
  pcVar1 = &(this->m_minReduction).m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  pcVar1 = &(this->m_minReduction).m_backend;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(this->m_minReduction).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(this->m_minReduction).m_backend.data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&this->m_minReduction,0.0001);
  this->spxout = (SPxOut *)0x0;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pTVar2 = TimerFactory::createTimer(ttype);
  this->m_timeUsed = pTVar2;
  return;
}

Assistant:

explicit SPxSimplifier(const char* p_name, Timer::TYPE ttype = Timer::USER_TIME)
      : m_name(p_name)
      , m_timeUsed(nullptr)
      , m_timerType(ttype)
      , m_remRows(0)
      , m_remCols(0)
      , m_remNzos(0)
      , m_chgBnds(0)
      , m_chgLRhs(0)
      , m_keptBnds(0)
      , m_keptLRhs(0)
      , m_objoffset(0.0)
      , m_minReduction(1e-4)
      , spxout(nullptr)
   {
      assert(isConsistent());

      m_timeUsed = TimerFactory::createTimer(ttype);
   }